

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindow.cpp
# Opt level: O0

QStatusBar * __thiscall QMainWindow::statusBar(QMainWindow *this)

{
  QMainWindowLayout *in_RDI;
  QStatusBar *unaff_retaddr;
  QMainWindow *self;
  QStatusBar *statusbar;
  QStatusBar *statusbar_00;
  undefined8 local_10;
  QMainWindowLayout *parent;
  
  parent = in_RDI;
  d_func((QMainWindow *)0x5e94ac);
  QPointer<QMainWindowLayout>::operator->((QPointer<QMainWindowLayout> *)0x5e94bb);
  local_10 = QMainWindowLayout::statusBar(in_RDI);
  if (local_10 == (QStatusBar *)0x0) {
    local_10 = (QStatusBar *)operator_new(0x28);
    QStatusBar::QStatusBar(unaff_retaddr,(QWidget *)parent);
    statusbar_00 = local_10;
    QWidget::setSizePolicy((QWidget *)in_RDI,(Policy)((ulong)local_10 >> 0x20),(Policy)local_10);
    setStatusBar((QMainWindow *)in_RDI,statusbar_00);
  }
  return local_10;
}

Assistant:

QStatusBar *QMainWindow::statusBar() const
{
    QStatusBar *statusbar = d_func()->layout->statusBar();
    if (!statusbar) {
        QMainWindow *self = const_cast<QMainWindow *>(this);
        statusbar = new QStatusBar(self);
        statusbar->setSizePolicy(QSizePolicy::Ignored, QSizePolicy::Fixed);
        self->setStatusBar(statusbar);
    }
    return statusbar;
}